

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcCondition::~IfcCondition(IfcCondition *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject = 0x96e188;
  *(undefined8 *)&(this->super_IfcGroup).field_0xf0 = 0x96e200;
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject.field_0x88 = 0x96e1b0;
  (this->super_IfcGroup).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
  ._vptr_ObjectHelper = (_func_int **)0x96e1d8;
  puVar2 = *(undefined1 **)
            &(this->super_IfcGroup).super_IfcObject.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10;
  puVar1 = &(this->super_IfcGroup).super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject = 0x96e2a0;
  *(undefined8 *)&(this->super_IfcGroup).field_0xf0 = 0x96e2c8;
  puVar2 = *(undefined1 **)&(this->super_IfcGroup).super_IfcObject.field_0x60;
  puVar1 = &(this->super_IfcGroup).super_IfcObject.field_0x70;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcGroup).super_IfcObject.field_0x38;
  puVar1 = &(this->super_IfcGroup).super_IfcObject.field_0x48;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcGroup).super_IfcObject.field_0x10;
  puVar1 = &(this->super_IfcGroup).super_IfcObject.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  operator_delete(this,0x108);
  return;
}

Assistant:

IfcCondition() : Object("IfcCondition") {}